

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegion *
memory_map_io_x86_64
          (uc_struct_conflict *uc,ram_addr_t begin,size_t size,uc_cb_mmio_read_t read_cb,
          uc_cb_mmio_write_t write_cb,void *user_data_read,void *user_data_write)

{
  MemoryRegion *mr;
  undefined8 *opaque;
  uint32_t uVar1;
  
  mr = (MemoryRegion *)g_malloc(0xa0);
  opaque = (undefined8 *)g_malloc(0x70);
  *opaque = read_cb;
  opaque[2] = write_cb;
  opaque[1] = user_data_read;
  opaque[3] = user_data_write;
  opaque[8] = 0;
  opaque[9] = 0;
  opaque[10] = 0;
  opaque[0xb] = 0;
  opaque[0xc] = 0;
  opaque[0xd] = 0;
  opaque[4] = mmio_read_wrapper;
  opaque[6] = 0;
  opaque[7] = 0;
  opaque[5] = mmio_write_wrapper;
  memory_region_init_io_x86_64(uc,mr,(MemoryRegionOps *)(opaque + 4),opaque,size);
  mr->destructor = mmio_region_destructor_uc;
  uVar1 = (read_cb != (uc_cb_mmio_read_t)0x0) + 2;
  if (write_cb == (uc_cb_mmio_write_t)0x0) {
    uVar1 = (uint32_t)(read_cb != (uc_cb_mmio_read_t)0x0);
  }
  mr->perms = uVar1;
  memory_region_add_subregion_x86_64(uc->system_memory,begin,mr);
  if (uc->cpu != (CPUState *)0x0) {
    tlb_flush_x86_64(uc->cpu);
  }
  return mr;
}

Assistant:

MemoryRegion *memory_map_io(struct uc_struct *uc, ram_addr_t begin, size_t size,
                            uc_cb_mmio_read_t read_cb, uc_cb_mmio_write_t write_cb,
                            void *user_data_read, void *user_data_write)
{
    MemoryRegion *mmio = g_new(MemoryRegion, 1);
    mmio_cbs* opaques = g_new(mmio_cbs, 1);
    MemoryRegionOps *ops = &opaques->ops;
    opaques->read = read_cb;
    opaques->write = write_cb;
    opaques->user_data_read = user_data_read;
    opaques->user_data_write = user_data_write;

    memset(ops, 0, sizeof(*ops));

    ops->read = mmio_read_wrapper;
    ops->read_with_attrs = NULL;
    ops->write = mmio_write_wrapper;
    ops->write_with_attrs = NULL;
    ops->endianness = DEVICE_NATIVE_ENDIAN;

    memory_region_init_io(uc, mmio, ops, opaques, size);

    mmio->destructor = mmio_region_destructor_uc;

    mmio->perms = 0;

    if (read_cb)
        mmio->perms |= UC_PROT_READ;

    if (write_cb)
        mmio->perms |= UC_PROT_WRITE;

    memory_region_add_subregion(uc->system_memory, begin, mmio);

    if (uc->cpu)
        tlb_flush(uc->cpu);

    return mmio;
}